

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_voter.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::ip_voter::maybe_rotate(ip_voter *this)

{
  pointer peVar1;
  undefined8 uVar2;
  address_v4 aVar3;
  bool bVar4;
  time_point tVar5;
  pointer peVar6;
  
  tVar5 = time_now();
  if ((0x31 < this->m_total_votes) ||
     (((this->m_total_votes != 0 &&
       (299999999999 < (long)tVar5.__d.__r - (this->m_last_rotate).__d.__r)) ||
      (this->m_valid_external == false)))) {
    peVar6 = (this->m_external_addresses).
             super__Vector_base<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar1 = (this->m_external_addresses).
             super__Vector_base<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (peVar6 != peVar1) {
      if ((long)peVar1 - (long)peVar6 == 0x38) {
        if (peVar6->num_votes < 2) {
          return false;
        }
      }
      else {
        ::std::
        __partial_sort<__gnu_cxx::__normal_iterator<libtorrent::aux::ip_voter::external_ip_t*,std::vector<libtorrent::aux::ip_voter::external_ip_t,std::allocator<libtorrent::aux::ip_voter::external_ip_t>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (peVar6,peVar6 + 2);
        peVar6 = (this->m_external_addresses).
                 super__Vector_base<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((uint)peVar6->num_votes * 2) / 3 <= (uint)peVar6[1].num_votes) {
          return false;
        }
      }
      bVar4 = boost::asio::ip::operator!=(&this->m_external_address,&peVar6->addr);
      aVar3.addr_.s_addr = (peVar6->addr).ipv4_address_.addr_;
      (this->m_external_address).type_ = (peVar6->addr).type_;
      (this->m_external_address).ipv4_address_ = (address_v4)aVar3.addr_.s_addr;
      uVar2 = *(undefined8 *)((long)&(peVar6->addr).ipv6_address_.addr_.__in6_u + 8);
      *(undefined8 *)&(this->m_external_address).ipv6_address_.addr_.__in6_u =
           *(undefined8 *)&(peVar6->addr).ipv6_address_.addr_.__in6_u;
      *(undefined8 *)((long)&(this->m_external_address).ipv6_address_.addr_.__in6_u + 8) = uVar2;
      (this->m_external_address).ipv6_address_.scope_id_ = (peVar6->addr).ipv6_address_.scope_id_;
      (this->m_external_address_voters).bits[0] = '\0';
      (this->m_external_address_voters).bits[1] = '\0';
      (this->m_external_address_voters).bits[2] = '\0';
      (this->m_external_address_voters).bits[3] = '\0';
      (this->m_external_address_voters).bits[4] = '\0';
      (this->m_external_address_voters).bits[5] = '\0';
      (this->m_external_address_voters).bits[6] = '\0';
      (this->m_external_address_voters).bits[7] = '\0';
      (this->m_external_address_voters).bits[8] = '\0';
      (this->m_external_address_voters).bits[9] = '\0';
      (this->m_external_address_voters).bits[10] = '\0';
      (this->m_external_address_voters).bits[0xb] = '\0';
      (this->m_external_address_voters).bits[0xc] = '\0';
      (this->m_external_address_voters).bits[0xd] = '\0';
      (this->m_external_address_voters).bits[0xe] = '\0';
      (this->m_external_address_voters).bits[0xf] = '\0';
      (this->m_external_address_voters).bits[0x10] = '\0';
      (this->m_external_address_voters).bits[0x11] = '\0';
      (this->m_external_address_voters).bits[0x12] = '\0';
      (this->m_external_address_voters).bits[0x13] = '\0';
      (this->m_external_address_voters).bits[0x14] = '\0';
      (this->m_external_address_voters).bits[0x15] = '\0';
      (this->m_external_address_voters).bits[0x16] = '\0';
      (this->m_external_address_voters).bits[0x17] = '\0';
      (this->m_external_address_voters).bits[0x18] = '\0';
      (this->m_external_address_voters).bits[0x19] = '\0';
      (this->m_external_address_voters).bits[0x1a] = '\0';
      (this->m_external_address_voters).bits[0x1b] = '\0';
      (this->m_external_address_voters).bits[0x1c] = '\0';
      (this->m_external_address_voters).bits[0x1d] = '\0';
      (this->m_external_address_voters).bits[0x1e] = '\0';
      (this->m_external_address_voters).bits[0x1f] = '\0';
      this->m_total_votes = 0;
      peVar6 = (this->m_external_addresses).
               super__Vector_base<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_external_addresses).
          super__Vector_base<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
          ._M_impl.super__Vector_impl_data._M_finish != peVar6) {
        (this->m_external_addresses).
        super__Vector_base<libtorrent::aux::ip_voter::external_ip_t,_std::allocator<libtorrent::aux::ip_voter::external_ip_t>_>
        ._M_impl.super__Vector_impl_data._M_finish = peVar6;
      }
      (this->m_last_rotate).__d.__r = (rep)tVar5.__d.__r;
      this->m_valid_external = true;
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool ip_voter::maybe_rotate()
	{
		time_point now = aux::time_now();

		// if we have more than or equal to 50 votes,
		// we rotate. Also, if it's been more than 5 minutes
		// and we have at least one vote, we also rotate.
		// this is the inverse condition, since this is the case
		// were we exit, without rotating
		if (m_total_votes < 50
			&& (now - m_last_rotate < minutes(5) || m_total_votes == 0)
			&& m_valid_external)
			return false;

		// this shouldn't really happen if we have at least one
		// vote.
		if (m_external_addresses.empty()) return false;

		// if there's just one vote, go with that
		if (m_external_addresses.size() == 1)
		{
			// avoid flapping. We need more votes to change our mind on the
			// external IP
			if (m_external_addresses[0].num_votes < 2) return false;
		}
		else
		{
			// find the top two votes.
			std::partial_sort(m_external_addresses.begin()
				, m_external_addresses.begin() + 2, m_external_addresses.end());

			// if we don't have enough of a majority voting for the winning
			// IP, don't rotate. This avoids flapping
			if (m_external_addresses[0].num_votes * 2 / 3 <= m_external_addresses[1].num_votes)
				return false;
		}

		auto const i = m_external_addresses.begin();

		bool ret = m_external_address != i->addr;
		m_external_address = i->addr;

		m_external_address_voters.clear();
		m_total_votes = 0;
		m_external_addresses.clear();
		m_last_rotate = now;
		m_valid_external = true;
		return ret;
	}